

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall leveldb::TableBuilder::Rep::Rep(Rep *this,Options *opt,WritableFile *f)

{
  FilterBlockBuilder *local_38;
  WritableFile *f_local;
  Options *opt_local;
  Rep *this_local;
  
  memcpy(this,opt,0x60);
  memcpy(&this->index_block_options,opt,0x60);
  this->file = f;
  this->offset = 0;
  Status::Status(&this->status);
  BlockBuilder::BlockBuilder(&this->data_block,&this->options);
  BlockBuilder::BlockBuilder(&this->index_block,&this->index_block_options);
  std::__cxx11::string::string((string *)&this->last_key);
  this->num_entries = 0;
  this->closed = false;
  if (opt->filter_policy == (FilterPolicy *)0x0) {
    local_38 = (FilterBlockBuilder *)0x0;
  }
  else {
    local_38 = (FilterBlockBuilder *)operator_new(0x90);
    FilterBlockBuilder::FilterBlockBuilder(local_38,opt->filter_policy);
  }
  this->filter_block = local_38;
  this->pending_index_entry = false;
  BlockHandle::BlockHandle(&this->pending_handle);
  std::__cxx11::string::string((string *)&this->compressed_output);
  (this->index_block_options).block_restart_interval = 1;
  return;
}

Assistant:

Rep(const Options& opt, WritableFile* f)
      : options(opt),
        index_block_options(opt),
        file(f),
        offset(0),
        data_block(&options),
        index_block(&index_block_options),
        num_entries(0),
        closed(false),
        filter_block(opt.filter_policy == nullptr
                         ? nullptr
                         : new FilterBlockBuilder(opt.filter_policy)),
        pending_index_entry(false) {
    index_block_options.block_restart_interval = 1;
  }